

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O0

size_t ECDSA_SIG_max_len(size_t order_len)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  size_t ret;
  size_t value_len;
  size_t integer_len;
  size_t order_len_local;
  
  sVar1 = der_len_len(order_len + 1);
  uVar2 = sVar1 + 2 + order_len;
  if (uVar2 < order_len) {
    order_len_local = 0;
  }
  else {
    sVar1 = uVar2 * 2;
    if (sVar1 < uVar2) {
      order_len_local = 0;
    }
    else {
      sVar3 = der_len_len(sVar1);
      order_len_local = sVar3 + 1 + sVar1;
      if (order_len_local < sVar1) {
        order_len_local = 0;
      }
    }
  }
  return order_len_local;
}

Assistant:

size_t ECDSA_SIG_max_len(size_t order_len) {
  // Compute the maximum length of an |order_len| byte integer. Defensively
  // assume that the leading 0x00 is included.
  size_t integer_len = 1 /* tag */ + der_len_len(order_len + 1) + 1 + order_len;
  if (integer_len < order_len) {
    return 0;
  }
  // An ECDSA signature is two INTEGERs.
  size_t value_len = 2 * integer_len;
  if (value_len < integer_len) {
    return 0;
  }
  // Add the header.
  size_t ret = 1 /* tag */ + der_len_len(value_len) + value_len;
  if (ret < value_len) {
    return 0;
  }
  return ret;
}